

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmGraphicsShaderTestUtil.cpp
# Opt level: O0

void __thiscall
vkt::SpirVAssembly::InstanceContext::InstanceContext
          (InstanceContext *this,RGBA (*inputs) [4],RGBA (*outputs) [4],
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *testCodeFragments_,StageToSpecConstantMap *specConstants_)

{
  RGBA *local_68;
  RGBA *local_48;
  allocator<char> local_3d [13];
  StageToSpecConstantMap *local_30;
  StageToSpecConstantMap *specConstants__local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *testCodeFragments__local;
  RGBA (*outputs_local) [4];
  RGBA (*inputs_local) [4];
  InstanceContext *this_local;
  
  local_30 = specConstants_;
  specConstants__local = (StageToSpecConstantMap *)testCodeFragments_;
  testCodeFragments__local =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)outputs;
  outputs_local = inputs;
  inputs_local = (RGBA (*) [4])this;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>_>
  ::map(&this->moduleMap);
  local_48 = this->inputColors;
  do {
    tcu::RGBA::RGBA(local_48);
    local_48 = local_48 + 1;
  } while (local_48 != this->outputColors);
  local_68 = this->outputColors;
  do {
    tcu::RGBA::RGBA(local_68);
    local_68 = local_68 + 1;
  } while ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_68 != &this->testCodeFragments);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->testCodeFragments,
        (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)specConstants__local);
  std::
  map<vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::map(&this->specConstants,local_30);
  this->hasTessellation = false;
  this->requiredStages = 0;
  this->failResult = QP_TEST_RESULT_FAIL;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->failMessageTemplate,"${reason}",local_3d);
  std::allocator<char>::~allocator(local_3d);
  this->inputColors[0].m_value = (*outputs_local)[0].m_value;
  this->inputColors[1].m_value = (*outputs_local)[1].m_value;
  this->inputColors[2].m_value = (*outputs_local)[2].m_value;
  this->inputColors[3].m_value = (*outputs_local)[3].m_value;
  this->outputColors[0].m_value = *(deUint32 *)&(testCodeFragments__local->_M_t)._M_impl;
  this->outputColors[1].m_value = *(deUint32 *)&(testCodeFragments__local->_M_t)._M_impl.field_0x4;
  this->outputColors[2].m_value =
       (testCodeFragments__local->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color;
  this->outputColors[3].m_value =
       *(deUint32 *)
        &(testCodeFragments__local->_M_t)._M_impl.super__Rb_tree_header._M_header.field_0x4;
  return;
}

Assistant:

InstanceContext::InstanceContext (const RGBA					(&inputs)[4],
								  const RGBA					(&outputs)[4],
								  const map<string, string>&	testCodeFragments_,
								  const StageToSpecConstantMap&	specConstants_)
	: testCodeFragments		(testCodeFragments_)
	, specConstants			(specConstants_)
	, hasTessellation		(false)
	, requiredStages		(static_cast<VkShaderStageFlagBits>(0))
	, failResult			(QP_TEST_RESULT_FAIL)
	, failMessageTemplate	("${reason}")
{
	inputColors[0]		= inputs[0];
	inputColors[1]		= inputs[1];
	inputColors[2]		= inputs[2];
	inputColors[3]		= inputs[3];

	outputColors[0]		= outputs[0];
	outputColors[1]		= outputs[1];
	outputColors[2]		= outputs[2];
	outputColors[3]		= outputs[3];
}